

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::arraySizeCheck
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *expr,TArraySize *sizePair,
          char *sizeType,bool isTypeParameter)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  uint uVar5;
  undefined4 extraout_var;
  TConstUnionArray *pTVar6;
  TConstUnion *pTVar7;
  undefined4 extraout_var_00;
  TIntermSymbol *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar8;
  TType *this_01;
  undefined4 extraout_var_05;
  TIntermSymbol *symbol;
  TIntermConstantUnion *constant;
  int size;
  bool isConst;
  bool isTypeParameter_local;
  char *sizeType_local;
  TArraySize *sizePair_local;
  TIntermTyped *expr_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  undefined4 extraout_var_01;
  
  bVar1 = false;
  sizePair->node = (TIntermTyped *)0x0;
  constant._0_4_ = 1;
  iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[5])();
  if ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar3) == (TIntermConstantUnion *)0x0) {
    iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x21])();
    bVar2 = TQualifier::isSpecConstant((TQualifier *)CONCAT44(extraout_var_00,iVar3));
    if (bVar2) {
      bVar1 = true;
      sizePair->node = expr;
      iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0xc])();
      this_00 = (TIntermSymbol *)CONCAT44(extraout_var_01,iVar3);
      if (this_00 != (TIntermSymbol *)0x0) {
        pTVar6 = TIntermSymbol::getConstArray(this_00);
        iVar3 = TConstUnionArray::size(pTVar6);
        if (0 < iVar3) {
          pTVar6 = TIntermSymbol::getConstArray(this_00);
          pTVar7 = TConstUnionArray::operator[](pTVar6,0);
          constant._0_4_ = TConstUnion::getIConst(pTVar7);
        }
      }
    }
    else {
      iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])();
      if (CONCAT44(extraout_var_02,iVar3) != 0) {
        iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])();
        TVar4 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_03,iVar3));
        if (TVar4 == EOpArrayLength) {
          iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])();
          plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x188))();
          this_01 = (TType *)(**(code **)(*plVar8 + 0xf0))();
          bVar2 = TType::isCoopMatNV(this_01);
          if (bVar2) {
            bVar1 = true;
            iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])();
            sizePair->node = (TIntermTyped *)CONCAT44(extraout_var_05,iVar3);
          }
        }
      }
      constant._0_4_ = 1;
    }
  }
  else {
    pTVar6 = TIntermConstantUnion::getConstArray
                       ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar3));
    pTVar7 = TConstUnionArray::operator[](pTVar6,0);
    constant._0_4_ = TConstUnion::getIConst(pTVar7);
    bVar1 = true;
  }
  sizePair->size = (uint)constant;
  if (isTypeParameter) {
    uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_NV_cooperative_matrix2");
    if ((uVar5 & 1) == 0) {
      if ((!bVar1) ||
         ((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 != 8 &&
          (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 != 9)))) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,sizeType,"","must be a constant integer expression");
        return;
      }
    }
    else if ((!bVar1) ||
            (((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 != 8 &&
              (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 != 9)) &&
             (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 != 0xc)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,sizeType,"","must be a constant integer or boolean expression");
      return;
    }
    if ((int)(uint)constant < 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,sizeType,"","must be a non-negative integer");
    }
  }
  else if ((bVar1) &&
          ((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 8 ||
           (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar3 == 9)))) {
    if ((int)(uint)constant < 1) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,sizeType,"","must be a positive integer");
    }
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,sizeType,"","must be a constant integer expression");
  }
  return;
}

Assistant:

void TParseContext::arraySizeCheck(const TSourceLoc& loc, TIntermTyped* expr, TArraySize& sizePair,
                                   const char* sizeType, const bool isTypeParameter)
{
    bool isConst = false;
    sizePair.node = nullptr;

    int size = 1;

    TIntermConstantUnion* constant = expr->getAsConstantUnion();
    if (constant) {
        // handle true (non-specialization) constant
        size = constant->getConstArray()[0].getIConst();
        isConst = true;
    } else {
        // see if it's a specialization constant instead
        if (expr->getQualifier().isSpecConstant()) {
            isConst = true;
            sizePair.node = expr;
            TIntermSymbol* symbol = expr->getAsSymbolNode();
            if (symbol && symbol->getConstArray().size() > 0)
                size = symbol->getConstArray()[0].getIConst();
        } else if (expr->getAsUnaryNode() && expr->getAsUnaryNode()->getOp() == glslang::EOpArrayLength &&
                   expr->getAsUnaryNode()->getOperand()->getType().isCoopMatNV()) {
            isConst = true;
            size = 1;
            sizePair.node = expr->getAsUnaryNode();
        }
    }

    sizePair.size = size;

    if (isTypeParameter) {
        if (extensionTurnedOn(E_GL_NV_cooperative_matrix2)) {
            if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint && expr->getBasicType() != EbtBool)) {
                error(loc, sizeType, "", "must be a constant integer or boolean expression");
                return;
            }
        } else {
            if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
                error(loc, sizeType, "", "must be a constant integer expression");
                return;
            }
        }
        if (size < 0) {
            error(loc, sizeType, "", "must be a non-negative integer");
            return;
        }
    } else {
        if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
            error(loc, sizeType, "", "must be a constant integer expression");
            return;
        }
        if (size <= 0) {
            error(loc, sizeType, "", "must be a positive integer");
            return;
        }
    }
}